

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O3

void xs::sendMessage(Socket *socket,Message *message)

{
  deSocketResult result;
  SocketError *this;
  ulong uVar1;
  ulong uVar2;
  size_t numSent;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t local_40;
  void *local_38;
  long lStack_30;
  long local_28;
  
  local_38 = (void *)0x0;
  lStack_30 = 0;
  local_28 = 0;
  (*message->_vptr_Message[2])(message);
  uVar1 = lStack_30 - (long)local_38;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      local_40 = 0;
      result = deSocket_send(socket->m_socket,(void *)((long)local_38 + uVar2),uVar1 - uVar2,
                             &local_40);
      if (result != DE_SOCKETRESULT_SUCCESS) {
        this = (SocketError *)__cxa_allocate_exception(0x18);
        SocketError::SocketError
                  (this,result,"send() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/tools/xsClient.cpp"
                   ,0x4e);
        __cxa_throw(this,&SocketError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar2 = uVar2 + local_40;
      uVar1 = lStack_30 - (long)local_38;
    } while (uVar2 < uVar1);
  }
  if (local_38 != (void *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return;
}

Assistant:

void sendMessage (de::Socket& socket, const Message& message)
{
	// Format message.
	vector<deUint8> buf;
	message.write(buf);

	// Write to socket.
	size_t pos = 0;
	while (pos < buf.size())
	{
		size_t			numLeft		= buf.size() - pos;
		size_t			numSent		= 0;
		deSocketResult	result		= socket.send(&buf[pos], numLeft, &numSent);

		if (result != DE_SOCKETRESULT_SUCCESS)
			throw SocketError(result, "send() failed", __FILE__, __LINE__);

		pos += numSent;
	}
}